

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicInputCase11::Run(BasicInputCase11 *this)

{
  CallLogWrapper *this_00;
  Vec4 *pVVar1;
  long lVar2;
  GLuint i;
  GLuint index;
  undefined8 local_30;
  undefined8 uStack_28;
  
  this_00 = &(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
             super_GLWrapper.super_CallLogWrapper;
  index = 0;
  do {
    glu::CallLogWrapper::glVertexAttrib4f(this_00,index,0.0,0.0,0.0,0.0);
    index = index + 1;
  } while (index != 0x10);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x30,(void *)0x0,0x88e4);
  local_30 = 0x400000003f800000;
  uStack_28 = 0x4080000040400000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x10,&local_30);
  local_30 = 0x40c0000040a00000;
  uStack_28 = 0x4100000040e00000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x10,0x10,&local_30);
  local_30 = 0x4120000041100000;
  uStack_28 = 0x4140000041300000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x20,0x10,&local_30);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vbo[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x30,(void *)0x0,0x88e4);
  local_30 = 0x41a0000041200000;
  uStack_28 = 0x4220000041f00000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0,0x10,&local_30);
  local_30 = 0x4270000042480000;
  uStack_28 = 0x42a00000428c0000;
  glu::CallLogWrapper::glBufferSubData(this_00,0x8892,0x10,0x10,&local_30);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,0,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,2,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribFormat(this_00,4,2,0x1406,'\0',4);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,1);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,4,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,2);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,4);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,0,this->m_vbo[0],0,0x10);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_vbo[0],0,0x10);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,2,this->m_vbo[1],4,8);
  glu::CallLogWrapper::glVertexBindingDivisor(this_00,1,1);
  (this->super_BasicInputBase).instance_count = 2;
  (this->super_BasicInputBase).expected_data[0].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0].m_data[1] = 2.0;
  (this->super_BasicInputBase).expected_data[0].m_data[2] = 3.0;
  (this->super_BasicInputBase).expected_data[0].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[2].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[2].m_data[1] = 2.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[2].m_data[2] = 3.0;
  pVVar1[2].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[4].m_data[0] = 30.0;
  (this->super_BasicInputBase).expected_data[4].m_data[1] = 40.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[4].m_data[2] = 0.0;
  pVVar1[4].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[0x10].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x10].m_data[2] = 7.0;
  pVVar1[0x10].m_data[3] = 8.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0x12].m_data[1] = 2.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x12].m_data[2] = 3.0;
  pVVar1[0x12].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[0] = 50.0;
  (this->super_BasicInputBase).expected_data[0x14].m_data[1] = 60.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x14].m_data[2] = 0.0;
  pVVar1[0x14].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x20].m_data[0] = 1.0;
  (this->super_BasicInputBase).expected_data[0x20].m_data[1] = 2.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x20].m_data[2] = 3.0;
  pVVar1[0x20].m_data[3] = 4.0;
  (this->super_BasicInputBase).expected_data[0x22].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[0x22].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x22].m_data[2] = 7.0;
  pVVar1[0x22].m_data[3] = 8.0;
  (this->super_BasicInputBase).expected_data[0x24].m_data[0] = 30.0;
  (this->super_BasicInputBase).expected_data[0x24].m_data[1] = 40.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x24].m_data[2] = 0.0;
  pVVar1[0x24].m_data[3] = 1.0;
  (this->super_BasicInputBase).expected_data[0x30].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[0x30].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x30].m_data[2] = 7.0;
  pVVar1[0x30].m_data[3] = 8.0;
  (this->super_BasicInputBase).expected_data[0x32].m_data[0] = 5.0;
  (this->super_BasicInputBase).expected_data[0x32].m_data[1] = 6.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x32].m_data[2] = 7.0;
  pVVar1[0x32].m_data[3] = 8.0;
  (this->super_BasicInputBase).expected_data[0x34].m_data[0] = 50.0;
  (this->super_BasicInputBase).expected_data[0x34].m_data[1] = 60.0;
  pVVar1 = (this->super_BasicInputBase).expected_data;
  pVVar1[0x34].m_data[2] = 0.0;
  pVVar1[0x34].m_data[3] = 1.0;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[0]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec4), &Vec4(1.0f, 2.0f, 3.0f, 4.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 16, sizeof(Vec4), &Vec4(5.0f, 6.0f, 7.0f, 8.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(Vec4), &Vec4(9.0f, 10.0f, 11.0f, 12.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo[1]);
		glBufferData(GL_ARRAY_BUFFER, sizeof(Vec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(Vec4), &Vec4(10.0f, 20.0f, 30.0f, 40.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 16, sizeof(Vec4), &Vec4(50.0f, 60.0f, 70.0f, 80.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(2, 4, GL_FLOAT, GL_FALSE, 0);
		glVertexAttribFormat(4, 2, GL_FLOAT, GL_FALSE, 4);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(2, 1);
		glVertexAttribBinding(4, 2);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);
		glEnableVertexAttribArray(4);
		glBindVertexBuffer(0, m_vbo[0], 0, 16);
		glBindVertexBuffer(1, m_vbo[0], 0, 16);
		glBindVertexBuffer(2, m_vbo[1], 4, 8);
		glVertexBindingDivisor(1, 1);

		instance_count		  = 2;
		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[2]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[4]	  = Vec4(30.0f, 40.0f, 0.0f, 1.0f);
		expected_data[0 + 16] = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[2 + 16] = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[4 + 16] = Vec4(50.0f, 60.0f, 0.0f, 1.0f);

		expected_data[0 + 32]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[2 + 32]	  = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[4 + 32]	  = Vec4(30.0f, 40.0f, 0.0f, 1.0f);
		expected_data[0 + 16 + 32] = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[2 + 16 + 32] = Vec4(5.0f, 6.0f, 7.0f, 8.0f);
		expected_data[4 + 16 + 32] = Vec4(50.0f, 60.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}